

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall GlobalMemoryAllocatorStash::save(GlobalMemoryAllocatorStash *this)

{
  TestMemoryAllocator *pTVar1;
  GlobalMemoryAllocatorStash *this_local;
  
  pTVar1 = getCurrentMallocAllocator();
  this->originalMallocAllocator = pTVar1;
  pTVar1 = getCurrentNewAllocator();
  this->originalNewAllocator = pTVar1;
  pTVar1 = getCurrentNewArrayAllocator();
  this->originalNewArrayAllocator = pTVar1;
  return;
}

Assistant:

void GlobalMemoryAllocatorStash::save()
{
    originalMallocAllocator = getCurrentMallocAllocator();
    originalNewAllocator = getCurrentNewAllocator();
    originalNewArrayAllocator = getCurrentNewArrayAllocator();
}